

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.cc
# Opt level: O2

BigUnsigned<4> *
absl::lts_20250127::strings_internal::BigUnsigned<4>::FiveToTheNth
          (BigUnsigned<4> *__return_storage_ptr__,int n)

{
  uint uVar1;
  bool bVar2;
  int n_00;
  ulong uVar3;
  int __n2;
  
  uVar3 = (ulong)(uint)n;
  BigUnsigned(__return_storage_ptr__,1);
  bVar2 = true;
  while( true ) {
    n_00 = (int)uVar3;
    if (n_00 < 0x1b) break;
    uVar1 = (uint)(uVar3 / 0x1b);
    if (0x13 < uVar1) {
      uVar1 = 0x14;
    }
    if (bVar2) {
      memcpy(__return_storage_ptr__->words_,
             (anonymous_namespace)::kLargePowersOfFive + (ulong)((uVar1 - 1) * uVar1) * 4,
             (ulong)(uVar1 * 8));
      __return_storage_ptr__->size_ = uVar1 * 2;
    }
    else {
      MultiplyBy(__return_storage_ptr__,uVar1 * 2,
                 (uint32_t *)
                 ((anonymous_namespace)::kLargePowersOfFive + (ulong)((uVar1 - 1) * uVar1) * 4));
    }
    uVar3 = (ulong)(n_00 + uVar1 * -0x1b);
    bVar2 = false;
  }
  MultiplyByFiveToTheNth(__return_storage_ptr__,n_00);
  return __return_storage_ptr__;
}

Assistant:

BigUnsigned<max_words> BigUnsigned<max_words>::FiveToTheNth(
    int n) {
  BigUnsigned answer(1u);

  // Seed from the table of large powers, if possible.
  bool first_pass = true;
  while (n >= kLargePowerOfFiveStep) {
    int big_power =
        std::min(n / kLargePowerOfFiveStep, kLargestPowerOfFiveIndex);
    if (first_pass) {
      // just copy, rather than multiplying by 1
      std::copy_n(LargePowerOfFiveData(big_power),
                  LargePowerOfFiveSize(big_power), answer.words_);
      answer.size_ = LargePowerOfFiveSize(big_power);
      first_pass = false;
    } else {
      answer.MultiplyBy(LargePowerOfFiveSize(big_power),
                        LargePowerOfFiveData(big_power));
    }
    n -= kLargePowerOfFiveStep * big_power;
  }
  answer.MultiplyByFiveToTheNth(n);
  return answer;
}